

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_reference.c
# Opt level: O1

void prf_external_reference_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_external_reference_info.opcode) {
    return;
  }
  prf_error(9,"external reference entry state method on node of type %d.");
  return;
}

Assistant:

static void
prf_external_reference_entry_f(prf_node_t * node,
                               prf_state_t * state)
{
  assert((node != NULL) && (state != NULL));

  if (node->opcode != prf_external_reference_info.opcode) {
    prf_error(9, "external reference entry state method on node of type %d.",
              node->opcode);
    return;
  }
  /* do nothing ? */
}